

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O2

insert_result * __thiscall
crnlib::
hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
::insert(insert_result *__return_storage_ptr__,
        hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
        *this,unsigned_long_long *k,empty_type *v)

{
  bool bVar1;
  
  (__return_storage_ptr__->first).m_pTable = (hash_map_type *)0x0;
  (__return_storage_ptr__->first).m_index = 0;
  __return_storage_ptr__->second = false;
  bVar1 = insert_no_grow(this,__return_storage_ptr__,k,v);
  if (!bVar1) {
    grow(this);
    bVar1 = insert_no_grow(this,__return_storage_ptr__,k,v);
    if (!bVar1) {
      crnlib_fail("\"insert() failed\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DaemonEngine[P]crunch/crnlib/crn_hash_map.h"
                  ,0x15d);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline insert_result insert(const Key& k, const Value& v = Value()) {
    insert_result result;
    if (!insert_no_grow(result, k, v)) {
      grow();

      // This must succeed.
      if (!insert_no_grow(result, k, v)) {
        CRNLIB_FAIL("insert() failed");
      }
    }

    return result;
  }